

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

void destroy_free<warm_cb>(void *temp)

{
  if (*(void **)((long)temp + 0x118) != (void *)0x0) {
    operator_delete(*(void **)((long)temp + 0x118));
  }
  if (*(void **)((long)temp + 0xe8) != (void *)0x0) {
    operator_delete(*(void **)((long)temp + 0xe8));
  }
  if (*(void **)((long)temp + 0xb0) != (void *)0x0) {
    operator_delete(*(void **)((long)temp + 0xb0));
  }
  if (*(void **)((long)temp + 0x58) != (void *)0x0) {
    operator_delete(*(void **)((long)temp + 0x58));
  }
  free(temp);
  return;
}

Assistant:

void destroy_free(void* temp)
{
  ((T*)temp)->~T();
  free(temp);
}